

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

void __thiscall semver::detail::range_parser::range_parser(range_parser *this,token_stream *stream)

{
  token_stream *stream_local;
  range_parser *this_local;
  
  token_stream::token_stream(&this->stream,stream);
  return;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(range_set<I1, I2, I3>& out) noexcept {
      std::vector<range<I1, I2, I3>> ranges;

      do {

        detail::range<I1, I2, I3> range;
        if (const auto res = parse_range(range); !res) {
          return res;
        }

        ranges.push_back(range);
        skip_whitespaces();

      } while (stream.advanceIfMatch(token_type::logical_or));

      out.ranges = std::move(ranges);

      return success(stream.peek().lexeme);
    }